

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O2

void __thiscall
MultiAgentDecisionProcess::SetNrAgents(MultiAgentDecisionProcess *this,size_t nrAgents)

{
  Index i;
  ulong uVar1;
  allocator<char> local_da;
  allocator<char> local_d9;
  vector<Agent,_std::allocator<Agent>_> *local_d8;
  size_t local_d0;
  string local_c8;
  string local_a8;
  Agent local_88;
  
  this->_m_nrAgents = nrAgents;
  local_d8 = &this->_m_agents;
  local_d0 = nrAgents;
  std::vector<Agent,_std::allocator<Agent>_>::clear(local_d8);
  uVar1 = 0;
  while (i = (Index)uVar1, uVar1 < local_d0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"undefined",&local_d9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"undefined",&local_da);
    Agent::Agent(&local_88,i,&local_a8,&local_c8);
    std::vector<Agent,_std::allocator<Agent>_>::emplace_back<Agent>(local_d8,&local_88);
    NamedDescribedEntity::~NamedDescribedEntity(&local_88.super_NamedDescribedEntity);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    Scope::Insert(&this->_m_allAgentsScope,i);
    uVar1 = (ulong)(i + 1);
  }
  return;
}

Assistant:

void MultiAgentDecisionProcess::SetNrAgents(size_t nrAgents) 
{
    _m_nrAgents = nrAgents;
    _m_agents.clear();
    for(Index i = 0; i < nrAgents; i++)
    {
        _m_agents.push_back(Agent(i));
        _m_allAgentsScope.Insert(i);
    }
}